

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void basic_suite::test_null_null(void)

{
  char cVar1;
  long *plVar2;
  undefined8 uVar3;
  encoder_type encoder;
  ostringstream result;
  long *local_1e0;
  undefined4 *local_1d8;
  long local_1d0 [2];
  undefined8 local_1c0;
  undefined **local_1b8;
  ostringstream *local_1b0;
  long local_190 [4];
  int aiStack_170 [20];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  local_1b8 = &PTR__base_00119b70;
  local_1b0 = (ostringstream *)local_190;
  if (*(int *)((long)aiStack_170 + *(long *)(local_190[0] + -0x18)) == 0) {
    plVar2 = (long *)0x4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"nullN5trial8protocol6buffer5arrayIcLm3ENS1_4baseIcEEEE",4);
  }
  else {
    plVar2 = (long *)0x0;
  }
  local_1c0 = CONCAT44(local_1c0._4_4_,4);
  local_1e0 = plVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::null>()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x89,"void basic_suite::test_null_null()",&local_1e0,&local_1c0);
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,1);
  if (cVar1 != '\0') {
    (*(code *)local_1b8[3])(&local_1b8,0x2c);
  }
  local_1e0 = (long *)(ulong)(cVar1 != '\0');
  local_1c0 = CONCAT44(local_1c0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::value_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x8a,"void basic_suite::test_null_null()",&local_1e0,&local_1c0);
  local_1e0 = (long *)0x4;
  local_1d8 = &trial::protocol::json::detail::basic_encoder<char,24ul>::null_value()::null_text;
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,4);
  if (cVar1 == '\0') {
    uVar3 = 0;
  }
  else {
    uVar3 = 4;
    (*(code *)local_1b8[4])(&local_1b8,&local_1e0);
  }
  local_1e0 = (long *)CONCAT44(local_1e0._4_4_,4);
  local_1c0 = uVar3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::null>()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x8b,"void basic_suite::test_null_null()",&local_1c0,&local_1e0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[10]>
            ("result.str()","\"null,null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x8c,"void basic_suite::test_null_null()",&local_1e0,"null,null");
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  (*(code *)*local_1b8)();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void test_null_null()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::null>(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::value_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::null>(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "null,null");
}